

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void labelfont_cb(Fl_Choice *i,void *v)

{
  Fl_Menu_Item *pFVar1;
  Fl_Widget_Type *this;
  bool bVar2;
  Fl_Font FVar3;
  int iVar4;
  int v_00;
  Fl_Widget_Type *q;
  Fl_Type **ppFVar5;
  
  if ((char *)v == "LOAD") {
    iVar4 = (current_widget->o->label_).font;
    v_00 = 0;
    if (iVar4 < 0x10) {
      v_00 = iVar4;
    }
    Fl_Choice::value(i,v_00);
    return;
  }
  pFVar1 = (i->super_Fl_Menu_).value_;
  if (pFVar1 == (Fl_Menu_Item *)0x0) {
    FVar3 = -1;
  }
  else {
    FVar3 = (Fl_Font)(((long)pFVar1 - (long)(i->super_Fl_Menu_).menu_) / 0x38);
  }
  bVar2 = false;
  ppFVar5 = &Fl_Type::first;
  while (this = (Fl_Widget_Type *)*ppFVar5, this != (Fl_Widget_Type *)0x0) {
    if ((this->super_Fl_Type).selected != '\0') {
      iVar4 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x17])(this);
      if (iVar4 != 0) {
        (this->o->label_).font = FVar3;
        Fl_Widget_Type::redraw(this);
        bVar2 = true;
      }
    }
    ppFVar5 = &(this->super_Fl_Type).next;
  }
  if (bVar2) {
    set_modflag(1);
    return;
  }
  return;
}

Assistant:

void labelfont_cb(Fl_Choice* i, void *v) {
  if (v == LOAD) {
    int n = current_widget->o->labelfont();
    if (n > 15) n = 0;
    i->value(n);
  } else {
    int mod = 0;
    int n = i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->o->labelfont(n);
	q->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}